

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O1

Vector * KDIS::DATA_TYPE::Vector::Lerp
                   (Vector *__return_storage_ptr__,Vector *From,Vector *To,KFLOAT32 T)

{
  undefined4 uVar1;
  undefined4 uVar2;
  KFLOAT32 KVar3;
  Vector *tmp_1;
  float fVar4;
  float fVar5;
  Vector tmp;
  DataTypeBase local_40;
  float local_38;
  float fStack_34;
  float local_30;
  DataTypeBase local_28;
  float local_20;
  float fStack_1c;
  float local_18;
  
  local_40._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_002216b8;
  uVar1 = To->m_f32X;
  uVar2 = To->m_f32Y;
  fVar4 = (float)uVar1 - (float)From->m_f32X;
  fVar5 = (float)uVar2 - (float)From->m_f32Y;
  _local_38 = CONCAT44(fVar5,fVar4);
  local_30 = (float)To->m_f32Z - (float)From->m_f32Z;
  local_28._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_002216b8;
  fVar4 = fVar4 * (float)T;
  fVar5 = fVar5 * (float)T;
  _local_20 = CONCAT44(fVar5,fVar4);
  local_18 = (float)T * local_30;
  (__return_storage_ptr__->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002216b8;
  KVar3 = From->m_f32Y;
  __return_storage_ptr__->m_f32X = From->m_f32X;
  __return_storage_ptr__->m_f32Y = KVar3;
  __return_storage_ptr__->m_f32Z = From->m_f32Z;
  __return_storage_ptr__->m_f32X = (KFLOAT32)(fVar4 + (float)__return_storage_ptr__->m_f32X);
  __return_storage_ptr__->m_f32Y = (KFLOAT32)(fVar5 + (float)__return_storage_ptr__->m_f32Y);
  __return_storage_ptr__->m_f32Z = (KFLOAT32)(local_18 + (float)__return_storage_ptr__->m_f32Z);
  DataTypeBase::~DataTypeBase(&local_28);
  DataTypeBase::~DataTypeBase(&local_40);
  return __return_storage_ptr__;
}

Assistant:

KFLOAT32 Vector::GetX() const
{
    return m_f32X;
}